

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

bool openZoneInfo(QString *name,QFile *file)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QLatin1StringView rhs_01;
  QLatin1StringView rhs_02;
  QStringView lhs;
  QStringView lhs_00;
  QStringView lhs_01;
  QStringView lhs_02;
  QLatin1StringView zoneShare;
  QStringBuilder<const_QLatin1String_&,_const_QString_&> local_80;
  QLatin1String local_70;
  QString local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  qEnvironmentVariable(&local_48,"TZDIR");
  if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
    QDir::QDir((QDir *)&local_70,&local_48);
    QDir::filePath(&local_60,(QDir *)&local_70,name);
    QFile::setFileName(file,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDir::~QDir((QDir *)&local_70);
    iVar2 = (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])(file,1);
    bVar1 = true;
    if ((char)iVar2 != '\0') goto LAB_00409252;
  }
  local_70.m_size = 0x14;
  local_70.m_data = "/usr/share/zoneinfo/";
  if ((undefined1 *)local_48.d.size == (undefined1 *)0x13) {
    local_70.m_data = "/usr/share/zoneinfo/";
    local_70.m_size = 0x14;
    rhs_00.m_data = "/usr/share/zoneinfo/";
    rhs_00.m_size = 0x13;
    lhs_00.m_data = local_48.d.ptr;
    lhs_00.m_size = 0x13;
    bVar1 = QtPrivate::equalStrings(lhs_00,rhs_00);
joined_r0x00409135:
    if (!bVar1) goto LAB_00409137;
  }
  else {
    if ((undefined1 *)local_48.d.size == (undefined1 *)0x14) {
      rhs.m_data = "/usr/share/zoneinfo/";
      rhs.m_size = 0x14;
      lhs.m_data = local_48.d.ptr;
      lhs.m_size = 0x14;
      bVar1 = QtPrivate::equalStrings(lhs,rhs);
      goto joined_r0x00409135;
    }
LAB_00409137:
    local_80.a = &local_70;
    local_80.b = name;
    QStringBuilder<const_QLatin1String_&,_const_QString_&>::convertTo<QString>(&local_60,&local_80);
    QFile::setFileName(file,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar2 = (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])(file,1);
    bVar1 = true;
    if ((char)iVar2 != '\0') goto LAB_00409252;
  }
  if ((undefined1 *)local_48.d.size == (undefined1 *)0x11) {
    rhs_02.m_data = "/usr/lib/zoneinfo/";
    rhs_02.m_size = 0x11;
    lhs_02.m_data = local_48.d.ptr;
    lhs_02.m_size = 0x11;
    bVar1 = QtPrivate::equalStrings(lhs_02,rhs_02);
joined_r0x004091ee:
    if (!bVar1) goto LAB_004091f0;
  }
  else {
    if ((undefined1 *)local_48.d.size == (undefined1 *)0x12) {
      rhs_01.m_data = "/usr/lib/zoneinfo/";
      rhs_01.m_size = 0x12;
      lhs_01.m_data = local_48.d.ptr;
      lhs_01.m_size = 0x12;
      bVar1 = QtPrivate::equalStrings(lhs_01,rhs_01);
      goto joined_r0x004091ee;
    }
LAB_004091f0:
    local_80.a = &local_70;
    local_80.b = name;
    QStringBuilder<const_QLatin1String_&,_const_QString_&>::convertTo<QString>(&local_60,&local_80);
    QFile::setFileName(file,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar2 = (*(file->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xd])(file,1);
    bVar1 = true;
    if ((char)iVar2 != '\0') goto LAB_00409252;
  }
  bVar1 = false;
LAB_00409252:
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool openZoneInfo(const QString &name, QFile *file)
{
    // At least on Linux / glibc (see man 3 tzset), $TZDIR overrides the system
    // default location for zone info:
    const QString tzdir = qEnvironmentVariable("TZDIR");
    if (!tzdir.isEmpty()) {
        file->setFileName(QDir(tzdir).filePath(name));
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    // Try modern system path first:
    constexpr auto zoneShare = "/usr/share/zoneinfo/"_L1;
    if (tzdir != zoneShare && tzdir != zoneShare.chopped(1)) {
        file->setFileName(zoneShare + name);
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    // Fall back to legacy system path:
    constexpr auto zoneLib = "/usr/lib/zoneinfo/"_L1;
    if (tzdir != zoneLib && tzdir != zoneLib.chopped(1)) {
        file->setFileName(zoneShare + name);
        if (file->open(QIODevice::ReadOnly))
            return true;
    }
    return false;
}